

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

int __thiscall QMetaObject::indexOfSlot(QMetaObject *this,char *slot)

{
  int iVar1;
  int iVar2;
  QArgumentType *in_R9;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView name;
  QMetaObject *m;
  QMetaObject *local_178;
  QArgumentTypeArray local_170;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_178 = this;
  memset(&local_170.super_QVLAStorage<32UL,_8UL,_10LL>,0xaa,0x140);
  local_170.super_QVLABase<QArgumentType>.super_QVLABaseBase.a = 10;
  local_170.super_QVLABase<QArgumentType>.super_QVLABaseBase.s = 0;
  local_170.super_QVLABase<QArgumentType>.super_QVLABaseBase.ptr =
       &local_170.super_QVLAStorage<32UL,_8UL,_10LL>;
  QVar3 = QMetaObjectPrivate::decodeMethodSignature(slot,&local_170);
  name.m_size = QVar3.m_data;
  name.m_data._0_4_ = (int)local_170.super_QVLABase<QArgumentType>.super_QVLABaseBase.s;
  name.m_data._4_4_ = 0;
  iVar1 = QMetaObjectPrivate::indexOfMethodRelative<8>
                    ((QMetaObjectPrivate *)&local_178,(QMetaObject **)QVar3.m_size,name,
                     (int)local_170.super_QVLABase<QArgumentType>.super_QVLABaseBase.ptr,in_R9);
  if (-1 < iVar1) {
    iVar2 = methodOffset(local_178);
    iVar1 = iVar1 + iVar2;
  }
  QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray(&local_170);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaObject::indexOfSlot(const char *slot) const
{
    const QMetaObject *m = this;
    int i;
    Q_ASSERT(priv(m->d.data)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(slot, types);
    i = QMetaObjectPrivate::indexOfSlotRelative(&m, name, types.size(), types.constData());
    if (i >= 0)
        i += m->methodOffset();
    return i;
}